

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::verifyCurrentVertexAttribf
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLfloat x,GLfloat y,GLfloat z,
               GLfloat w)

{
  GLfloat index_00;
  CallLogWrapper *this;
  qpTestResult qVar1;
  float (*pafVar2) [4];
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1e0;
  undefined1 local_5c [8];
  StateQueryMemoryWriteGuard<float[4]> attribValue;
  GLfloat w_local;
  GLfloat z_local;
  GLfloat y_local;
  GLfloat x_local;
  GLint index_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  attribValue.m_postguard[2] = w;
  attribValue.m_postguard[3] = z;
  w_local = y;
  z_local = x;
  y_local = (GLfloat)index;
  _x_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[4]> *)local_5c);
  this = _x_local;
  index_00 = y_local;
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  glu::CallLogWrapper::glGetVertexAttribfv(this,(GLuint)index_00,0x8626,*pafVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
            ((StateQueryMemoryWriteGuard<float[4]> *)local_5c,(TestContext *)gl_local);
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  if (((*pafVar2)[0] == z_local) && (!NAN((*pafVar2)[0]) && !NAN(z_local))) {
    pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    if (((*pafVar2)[1] == w_local) && (!NAN((*pafVar2)[1]) && !NAN(w_local))) {
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
      if (((*pafVar2)[2] == attribValue.m_postguard[3]) &&
         (!NAN((*pafVar2)[2]) && !NAN(attribValue.m_postguard[3]))) {
        pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
        if (((*pafVar2)[3] == attribValue.m_postguard[2]) &&
           (!NAN((*pafVar2)[3]) && !NAN(attribValue.m_postguard[2]))) {
          return;
        }
      }
    }
  }
  this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
  tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [21])"// ERROR: Expected [");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&z_local);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&w_local);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 3);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0xad9dc4);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [6])0xad8629);
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 2);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xafd6ae);
  pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 3);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0xacaf61);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e0);
  qVar1 = tcu::TestContext::getTestResult((TestContext *)gl_local);
  if (qVar1 == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult
              ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"got invalid attribute value");
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribf (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLfloat x, GLfloat y, GLfloat z, GLfloat w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> attribValue;
	gl.glGetVertexAttribfv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	if (attribValue[0] != x || attribValue[1] != y || attribValue[2] != z || attribValue[3] != w)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: Expected [" << x << "," << y << "," << z << "," << w << "];"
			<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
			<< TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
	}
}